

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::value::AssetPath>::construct_value
          (storage_t<tinyusdz::value::AssetPath> *this,value_type *v)

{
  value_type *this_00;
  value_type *v_local;
  storage_t<tinyusdz::value::AssetPath> *this_local;
  
  this_00 = value_ptr(this);
  tinyusdz::value::AssetPath::AssetPath(this_00,v);
  return;
}

Assistant:

void construct_value( value_type const & v )
    {
        ::new( value_ptr() ) value_type( v );
    }